

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<lsh::vector_const&>::
captureExpression<(Catch::Internal::Operator)0,lsh::vector>
          (ExpressionLhs<lsh::vector_const&> *this,vector *rhs)

{
  ResultBuilder *pRVar1;
  bool bVar2;
  OfType OVar3;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  
  pRVar1 = *(ResultBuilder **)this;
  bVar2 = lsh::vector::operator==(*(vector **)(this + 8),rhs);
  OVar3 = ExpressionFailed;
  if (bVar2) {
    OVar3 = Ok;
  }
  (pRVar1->m_data).resultType = OVar3;
  std::__cxx11::string::string(local_30,(string *)Detail::unprintableString_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  std::__cxx11::string::string(local_50,(string *)Detail::unprintableString_abi_cxx11_);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  std::__cxx11::string::string(local_70,"==",&local_71);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }